

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_on_priority_update_received(nghttp2_session *session,nghttp2_frame *frame)

{
  int iVar1;
  int iVar2;
  long in_RSI;
  nghttp2_frame *in_RDI;
  undefined4 unaff_retaddr;
  nghttp2_stream_state unaff_retaddr_00;
  nghttp2_priority_spec *in_stack_00000008;
  uint8_t in_stack_00000013;
  int32_t in_stack_00000014;
  int rv;
  nghttp2_extpri extpri;
  nghttp2_priority_spec pri_spec;
  nghttp2_stream *stream;
  nghttp2_ext_priority_update *priority_update;
  undefined4 in_stack_ffffffffffffffa8;
  int32_t in_stack_ffffffffffffffac;
  uint8_t u8extpri;
  nghttp2_frame *in_stack_ffffffffffffffb0;
  nghttp2_session *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int32_t in_stack_ffffffffffffffcc;
  nghttp2_session *local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*(uint8_t *)((long)in_RDI + 0xb74) == '\0') {
    __assert_fail("session->server",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                  ,0x14b3,
                  "int nghttp2_session_on_priority_update_received(nghttp2_session *, nghttp2_frame *)"
                 );
  }
  if (*(int *)(in_RSI + 8) == 0) {
    iVar1 = nghttp2_session_is_my_stream_id
                      ((nghttp2_session *)&in_RDI->hd,**(int32_t **)(in_RSI + 0x10));
    if (iVar1 == 0) {
      local_28 = (nghttp2_session *)
                 nghttp2_session_get_stream_raw
                           ((nghttp2_session *)&in_stack_ffffffffffffffb0->hd,
                            in_stack_ffffffffffffffac);
      if (local_28 == (nghttp2_session *)0x0) {
        iVar1 = session_detect_idle_stream
                          ((nghttp2_session *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
        if (iVar1 == 0) {
          iVar1 = session_call_on_frame_received
                            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
          return iVar1;
        }
        if ((ulong)*(uint32_t *)((long)in_RDI + 0xb4c) <=
            *(size_t *)((long)in_RDI + 0xab0) + *(size_t *)((long)in_RDI + 0xa90)) {
          iVar1 = session_handle_invalid_connection
                            ((nghttp2_session *)
                             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                             (nghttp2_frame *)
                             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                             (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                             (char *)in_stack_ffffffffffffffb0);
          return iVar1;
        }
        nghttp2_priority_spec_default_init((nghttp2_priority_spec *)&stack0xffffffffffffffcc);
        local_28 = (nghttp2_session *)
                   nghttp2_session_open_stream
                             (_rv,in_stack_00000014,in_stack_00000013,in_stack_00000008,
                              unaff_retaddr_00,
                              (void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
        ;
        if (local_28 == (nghttp2_session *)0x0) {
          return -0x385;
        }
      }
      else if (((local_28->root).recv_reduction & 0x20) != 0) {
        iVar1 = session_call_on_frame_received(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
        return iVar1;
      }
      u8extpri = (uint8_t)((uint)in_stack_ffffffffffffffac >> 0x18);
      iVar1 = nghttp2_http_parse_priority
                        ((nghttp2_extpri *)in_stack_00000008,
                         (uint8_t *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (iVar1 == 0) {
        nghttp2_extpri_to_uint8((nghttp2_extpri *)&stack0xffffffffffffffc4);
        iVar1 = session_update_stream_priority(local_28,(nghttp2_stream *)&in_RDI->hd,u8extpri);
        if ((iVar1 == 0) || (iVar2 = nghttp2_is_fatal(iVar1), iVar2 == 0)) {
          iVar1 = session_call_on_frame_received(local_28,in_RDI);
        }
      }
      else {
        iVar1 = session_call_on_frame_received(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      }
    }
    else {
      iVar1 = session_detect_idle_stream
                        ((nghttp2_session *)
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
      if (iVar1 == 0) {
        iVar1 = session_call_on_frame_received(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      }
      else {
        iVar1 = session_handle_invalid_connection
                          ((nghttp2_session *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           (nghttp2_frame *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                           (char *)in_stack_ffffffffffffffb0);
      }
    }
  }
  else {
    iVar1 = session_handle_invalid_connection
                      ((nghttp2_session *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (nghttp2_frame *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                       (char *)in_stack_ffffffffffffffb0);
  }
  return iVar1;
}

Assistant:

int nghttp2_session_on_priority_update_received(nghttp2_session *session,
                                                nghttp2_frame *frame) {
  nghttp2_ext_priority_update *priority_update;
  nghttp2_stream *stream;
  nghttp2_priority_spec pri_spec;
  nghttp2_extpri extpri;
  int rv;

  assert(session->server);

  priority_update = frame->ext.payload;

  if (frame->hd.stream_id != 0) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "PRIORITY_UPDATE: stream_id == 0");
  }

  if (nghttp2_session_is_my_stream_id(session, priority_update->stream_id)) {
    if (session_detect_idle_stream(session, priority_update->stream_id)) {
      return session_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_PROTO,
        "PRIORITY_UPDATE: prioritizing idle push is not allowed");
    }

    /* TODO Ignore priority signal to a push stream for now */
    return session_call_on_frame_received(session, frame);
  }

  stream = nghttp2_session_get_stream_raw(session, priority_update->stream_id);
  if (stream) {
    /* Stream already exists. */
    if (stream->flags & NGHTTP2_STREAM_FLAG_IGNORE_CLIENT_PRIORITIES) {
      return session_call_on_frame_received(session, frame);
    }
  } else if (session_detect_idle_stream(session, priority_update->stream_id)) {
    if (session->num_idle_streams + session->num_incoming_streams >=
        session->local_settings.max_concurrent_streams) {
      return session_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_PROTO,
        "PRIORITY_UPDATE: max concurrent streams exceeded");
    }

    nghttp2_priority_spec_default_init(&pri_spec);
    stream = nghttp2_session_open_stream(session, priority_update->stream_id,
                                         NGHTTP2_FLAG_NONE, &pri_spec,
                                         NGHTTP2_STREAM_IDLE, NULL);
    if (!stream) {
      return NGHTTP2_ERR_NOMEM;
    }
  } else {
    return session_call_on_frame_received(session, frame);
  }

  extpri.urgency = NGHTTP2_EXTPRI_DEFAULT_URGENCY;
  extpri.inc = 0;

  rv = nghttp2_http_parse_priority(&extpri, priority_update->field_value,
                                   priority_update->field_value_len);
  if (rv != 0) {
    /* Just ignore field_value if it cannot be parsed. */
    return session_call_on_frame_received(session, frame);
  }

  rv = session_update_stream_priority(session, stream,
                                      nghttp2_extpri_to_uint8(&extpri));
  if (rv != 0) {
    if (nghttp2_is_fatal(rv)) {
      return rv;
    }
  }

  return session_call_on_frame_received(session, frame);
}